

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O3

pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest> __thiscall
helics::CallbackFederate::operateCallback(CallbackFederate *this,iteration_time newTime)

{
  TimeRepresentation<count_time<9,_long>_> nextStep;
  Time newTime_00;
  Federate *this_00;
  undefined8 unaff_R12;
  ulong uVar1;
  baseType bVar2;
  pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest> pVar3;
  undefined1 auVar4 [12];
  
  newTime_00 = newTime.grantedTime.internalTimeCode;
  this_00 = (Federate *)
            ((long)&(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate +
            (long)(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3]);
  if (newTime.state == NEXT_STEP && newTime_00.internalTimeCode == 0) {
    Federate::enteringExecutingMode(this_00,(iteration_time)ZEXT816(0));
  }
  else {
    Federate::postTimeRequestOperations(this_00,newTime_00,newTime.state == ITERATING);
  }
  bVar2 = 0;
  nextStep.internalTimeCode = 0x7fffffffffffffff;
  if ((this->super_CombinationFederate).super_ValueFederate.field_0x30 != '\0') {
    bVar2 = 0x7fffffffffffffff;
  }
  uVar1 = CONCAT71((int7)((ulong)unaff_R12 >> 8),3);
  if (newTime_00.internalTimeCode <
      *(long *)(&(this->super_CombinationFederate).super_ValueFederate.field_0x30 +
               (long)(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3]))
  {
    if (*(long *)&(this->super_CombinationFederate).super_ValueFederate.field_0x68 == 0) {
      if (*(long *)&(this->super_CombinationFederate).super_ValueFederate.field_0x88 != 0) {
        bVar2 = (**(code **)&(this->super_CombinationFederate).super_ValueFederate.field_0x90)
                          (&(this->super_CombinationFederate).super_ValueFederate.field_0x78);
      }
      uVar1 = 0;
      nextStep.internalTimeCode = bVar2;
    }
    else {
      auVar4 = (**(code **)&(this->super_CombinationFederate).super_ValueFederate.field_0x70)
                         (&(this->super_CombinationFederate).super_ValueFederate.field_0x58);
      nextStep.internalTimeCode = auVar4._0_8_;
      uVar1 = (ulong)auVar4._8_4_;
      if ('\x02' < auVar4[8]) goto LAB_00268193;
    }
    Federate::preTimeRequestOperations
              ((Federate *)
               ((long)&(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate +
               (long)(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3]),
               (Time)nextStep.internalTimeCode,(char)uVar1 != '\0');
  }
LAB_00268193:
  pVar3._8_8_ = uVar1 & 0xffffffff;
  pVar3.first.internalTimeCode = nextStep.internalTimeCode;
  return pVar3;
}

Assistant:

std::pair<Time, IterationRequest> CallbackFederate::operateCallback(iteration_time newTime)
{
    if (newTime.grantedTime == timeZero && newTime.state == IterationResult::NEXT_STEP) {
        enteringExecutingMode(newTime);
    } else {
        postTimeRequestOperations(newTime.grantedTime, newTime.state == IterationResult::ITERATING);
    }
    // time zero here is equivalent to the next allowable time
    auto rval = std::make_pair((mEventTriggered) ? Time::maxVal() : timeZero,
                               IterationRequest::NO_ITERATIONS);

    if (newTime.grantedTime >= mStopTime) {
        rval = std::make_pair(Time::maxVal(), IterationRequest::HALT_OPERATIONS);
    } else if (nextTimeOperation1) {
        rval = nextTimeOperation1(newTime);
    } else if (nextTimeOperation2) {
        rval = std::make_pair(nextTimeOperation2(newTime.grantedTime),
                              IterationRequest::NO_ITERATIONS);
    }
    if (rval.second <= IterationRequest::ITERATE_IF_NEEDED) {
        preTimeRequestOperations(rval.first, rval.second != IterationRequest::NO_ITERATIONS);
    }

    return rval;
}